

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mos6502.cpp
# Opt level: O2

void __thiscall n_e_s::core::Mos6502::execute(Mos6502 *this)

{
  Pipeline *this_00;
  uint64_t *puVar1;
  bool bVar2;
  Pipeline local_70;
  
  this_00 = &this->pipeline_;
  bVar2 = Pipeline::done(this_00);
  if (bVar2) {
    if (this->nmi_ == true) {
      create_nmi(&local_70,this);
      Pipeline::operator=(this_00,&local_70);
      std::
      deque<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
      ::~deque(&local_70.steps_);
      this->nmi_ = false;
    }
    else {
      parse_next_instruction(&local_70,this);
      Pipeline::operator=(this_00,&local_70);
      std::
      deque<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
      ::~deque(&local_70.steps_);
    }
  }
  else {
    Pipeline::execute_step(this_00);
  }
  puVar1 = &(this->state_).cycle;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

void Mos6502::execute() {
    if (pipeline_.done()) {
        if (nmi_) {
            pipeline_ = create_nmi();
            nmi_ = false;
        } else {
            pipeline_ = parse_next_instruction();
        }
    } else {
        pipeline_.execute_step();
    }
    ++state_.cycle;
}